

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_module * ly_ctx_get_module_by(ly_ctx *ctx,char *key,int offset,char *revision,int with_disabled)

{
  uint uVar1;
  lys_module *plVar2;
  int iVar3;
  LY_ERR *pLVar4;
  lys_module *plVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (key == (char *)0x0 || ctx == (ly_ctx *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    plVar5 = (lys_module *)0x0;
  }
  else {
    uVar1 = (ctx->models).used;
    uVar7 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar7;
    }
    plVar5 = (lys_module *)0x0;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      plVar2 = (ctx->models).list[uVar7];
      if (with_disabled == 0) {
        if ((plVar2->field_0x40 & 0x40) == 0) goto LAB_0010fdaa;
      }
      else if (plVar2 != (lys_module *)0x0) {
LAB_0010fdaa:
        iVar3 = strcmp(key,*(char **)((long)&plVar2->ctx + (ulong)(uint)offset));
        if (iVar3 == 0) {
          if (revision == (char *)0x0) {
            if ((plVar5 == (lys_module *)0x0) ||
               ((plVar2->rev_size != '\0' &&
                ((plVar5->rev_size == '\0' ||
                 (iVar3 = strcmp(plVar2->rev->date,plVar5->rev->date), -1 < iVar3)))))) {
              plVar5 = plVar2;
            }
          }
          else if ((plVar2->rev_size != '\0') &&
                  (iVar3 = strcmp(revision,plVar2->rev->date), iVar3 == 0)) {
            return plVar2;
          }
        }
      }
    }
  }
  return plVar5;
}

Assistant:

static const struct lys_module *
ly_ctx_get_module_by(const struct ly_ctx *ctx, const char *key, int offset, const char *revision, int with_disabled)
{
    int i;
    struct lys_module *result = NULL;

    if (!ctx || !key) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for (i = 0; i < ctx->models.used; i++) {
        if (!with_disabled && ctx->models.list[i]->disabled) {
            /* skip the disabled modules */
            continue;
        }
        /* use offset to get address of the pointer to string (char**), remember that offset is in
         * bytes, so we have to cast the pointer to the module to (char*), finally, we want to have
         * string not the pointer to string
         */
        if (!ctx->models.list[i] || strcmp(key, *(char**)(((char*)ctx->models.list[i]) + offset))) {
            continue;
        }

        if (!revision) {
            /* compare revisons and remember the newest one */
            if (result) {
                if (!ctx->models.list[i]->rev_size) {
                    /* the current have no revision, keep the previous with some revision */
                    continue;
                }
                if (result->rev_size && strcmp(ctx->models.list[i]->rev[0].date, result->rev[0].date) < 0) {
                    /* the previous found matching module has a newer revision */
                    continue;
                }
            }

            /* remember the current match and search for newer version */
            result = ctx->models.list[i];
        } else {
            if (ctx->models.list[i]->rev_size && !strcmp(revision, ctx->models.list[i]->rev[0].date)) {
                /* matching revision */
                result = ctx->models.list[i];
                break;
            }
        }
    }

    return result;

}